

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libauthretry.c
# Opt level: O1

int test(char *url)

{
  int iVar1;
  CURLcode CVar2;
  long auth_scheme;
  long auth_scheme_00;
  CURL *curl;
  char *pcVar3;
  
  auth_scheme = parse_auth_name(libtest_arg2);
  auth_scheme_00 = parse_auth_name(libtest_arg3);
  if (auth_scheme_00 == 0 || auth_scheme == 0) {
    pcVar3 = "auth schemes not found on commandline\n";
  }
  else {
    iVar1 = curl_global_init(3);
    if (iVar1 == 0) {
      curl = (CURL *)curl_easy_init();
      if (curl == (CURL *)0x0) {
LAB_00101372:
        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
        curl_global_cleanup();
        return 0x7e;
      }
      CVar2 = send_request(curl,url,100,auth_scheme,"testuser:wrongpass");
      if ((CVar2 == CURLE_OK) &&
         (CVar2 = send_request(curl,url,200,auth_scheme_00,"testuser:testpass"), CVar2 == CURLE_OK))
      {
        curl_easy_cleanup(curl);
        curl = (CURL *)curl_easy_init();
        if (curl == (CURL *)0x0) goto LAB_00101372;
        CVar2 = send_request(curl,url,300,auth_scheme,"testuser:wrongpass");
        if ((CVar2 == CURLE_OK) &&
           (CVar2 = send_request(curl,url,400,auth_scheme_00,"testuser:wrongpass"),
           CVar2 == CURLE_OK)) {
          CVar2 = send_request(curl,url,500,auth_scheme_00,"testuser:testpass");
        }
      }
      curl_easy_cleanup(curl);
      curl_global_cleanup();
      return CVar2;
    }
    pcVar3 = "curl_global_init() failed\n";
  }
  curl_mfprintf(_stderr,pcVar3);
  return 0x7e;
}

Assistant:

int test(char *url)
{
  CURLcode res;
  CURL *curl = NULL;

  long main_auth_scheme = parse_auth_name(libtest_arg2);
  long fallback_auth_scheme = parse_auth_name(libtest_arg3);

  if(main_auth_scheme == CURLAUTH_NONE ||
      fallback_auth_scheme == CURLAUTH_NONE) {
    fprintf(stderr, "auth schemes not found on commandline\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Send wrong password, then right password */

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  res = send_wrong_password(curl, url, 100, main_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_right_password(curl, url, 200, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  curl_easy_cleanup(curl);

  /* Send wrong password twice, then right password */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  res = send_wrong_password(curl, url, 300, main_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_wrong_password(curl, url, 400, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

  res = send_right_password(curl, url, 500, fallback_auth_scheme);
  if(res != CURLE_OK)
    goto test_cleanup;

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}